

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ostream *poVar1;
  int iVar2;
  DataLisp lisp;
  SourceLogger logger;
  string content;
  DataLisp local_70 [8];
  string local_68;
  SourceLogger local_48 [16];
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  if (argc == 2) {
    local_30 = 0;
    local_28 = 0;
    local_38 = &local_28;
    get_file_contents_abi_cxx11_(&local_68,argv[1]);
    std::__cxx11::string::operator=((string *)&local_38,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    DL::SourceLogger::SourceLogger(local_48);
    DL::DataLisp::DataLisp(local_70,local_48,true);
    DL::DataLisp::parse((string *)local_70);
    DL::DataLisp::dump_abi_cxx11_();
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    DL::DataLisp::~DataLisp(local_70);
    DL::SourceLogger::~SourceLogger(local_48);
    iVar2 = 0;
    if (local_38 != &local_28) {
      operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
      iVar2 = 0;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Use \'dl_dump [INPUT]\'",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
	if (argc != 2)
	{
		std::cout << "Use 'dl_dump [INPUT]'" << std::endl;
		return -1;
	}

	std::string content;
	try
	{
		content = get_file_contents(argv[1]);
	}
	catch (...)
	{
		std::cout << "Couldn't read file '" << argv[1] << "'" << std::endl;
		return -2;
	}

	DL::SourceLogger logger;
	DL::DataLisp lisp(&logger);

	lisp.parse(content);
	std::cout << lisp.dump() << std::endl;

	return 0;
}